

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop_level.c
# Opt level: O0

void prf_pop_level_exit_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_pop_level_info.opcode) {
    *(short *)(in_RSI + 0x76) = *(short *)(in_RSI + 0x76) + -1;
  }
  else {
    prf_error(9,"tried pop level exit state method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_pop_level_exit_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );
    if ( node->opcode != prf_pop_level_info.opcode ) {
        prf_error( 9, "tried pop level exit state method on node of type %d.",
            node->opcode );
        return;
    }
    state->push_level--;
}